

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_writer.cpp
# Opt level: O0

string * __thiscall
duckdb::NumericStatsUnifier<unsigned_long>::StatsToString
          (NumericStatsUnifier<unsigned_long> *this,string *stats)

{
  ulong uVar1;
  char *src;
  const_data_ptr_t ptr;
  string *in_RDI;
  Value local_58 [88];
  
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    src = (char *)std::__cxx11::string::data();
    ptr = const_data_ptr_cast<char>(src);
    Load<unsigned_long>(ptr);
    duckdb::Value::CreateValue<unsigned_long>((ulong)local_58);
    duckdb::Value::ToString_abi_cxx11_();
    duckdb::Value::~Value(local_58);
  }
  else {
    std::__cxx11::string::string(in_RDI);
  }
  return in_RDI;
}

Assistant:

string StatsToString(const string &stats) override {
		if (stats.empty()) {
			return string();
		}
		return Value::CreateValue<T>(Load<T>(const_data_ptr_cast(stats.data()))).ToString();
	}